

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

void decode_residue(vorb *f,float **residue_buffers,wchar_t ch,wchar_t n,wchar_t rn,
                   uint8 *do_not_decode)

{
  byte bVar1;
  uint32 uVar2;
  float **ppfVar3;
  uint uVar4;
  uint uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  int iVar8;
  void **p;
  int iVar9;
  long *plVar10;
  long lVar11;
  wchar_t wVar12;
  int iVar13;
  ulong uVar14;
  long *plVar15;
  wchar_t wVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  uint8 *puVar20;
  ulong uVar21;
  float *pfVar22;
  vorb *pvVar23;
  Residue *pRVar24;
  ulong uVar25;
  Codebook *pCVar26;
  long lVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  long alStack_d8 [4];
  wchar_t local_b4;
  long local_b0;
  wchar_t class_set;
  float **local_a0;
  uint8 *local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  int local_74;
  long *local_70;
  Residue *local_68;
  uint16 local_5a;
  wchar_t local_58;
  wchar_t local_54;
  wchar_t c_inter;
  wchar_t p_inter;
  ulong local_48;
  char local_39;
  wchar_t local_38;
  wchar_t local_34;
  
  local_98 = do_not_decode;
  local_a0 = residue_buffers;
  pRVar24 = f->residue_config;
  local_5a = f->residue_types[(uint)rn];
  local_90 = (ulong)(uint)n;
  uVar4 = n << (f->residue_types[(uint)rn] == 2);
  local_80 = (long)f->codebooks[pRVar24[(uint)rn].classbook].dimensions;
  uVar5 = pRVar24[(uint)rn].begin;
  if (uVar4 <= pRVar24[(uint)rn].begin) {
    uVar5 = uVar4;
  }
  if (pRVar24[(uint)rn].end < uVar4) {
    uVar4 = pRVar24[(uint)rn].end;
  }
  local_48 = (ulong)(uVar4 - uVar5) / (ulong)pRVar24[(uint)rn].part_size;
  local_b4 = f->temp_offset;
  iVar13 = (int)local_48;
  if ((f->alloc).alloc_buffer == (char *)0x0) {
    local_70 = (long *)((long)alStack_d8 -
                       (((long)iVar13 * 8 + 8) * (long)f->channels + 0xfU & 0xfffffffffffffff0));
    plVar15 = local_70;
  }
  else {
    local_70 = (long *)setup_temp_malloc(f,(iVar13 * 8 + 8) * f->channels);
    plVar15 = alStack_d8;
  }
  lVar19 = (long)f->channels;
  if (0 < lVar19) {
    iVar13 = (int)local_48;
    plVar10 = local_70 + lVar19;
    lVar17 = 0;
    do {
      local_70[lVar17] = (long)plVar10;
      plVar10 = (long *)((long)plVar10 + (long)(iVar13 * 8));
      lVar17 = lVar17 + 1;
    } while (lVar19 != lVar17);
  }
  local_88 = (ulong)(uint)ch;
  local_38 = ch;
  puVar20 = local_98;
  if (L'\0' < ch) {
    lVar19 = (long)(int)local_90;
    uVar25 = 0;
    do {
      if (puVar20[uVar25] == '\0') {
        pfVar22 = local_a0[uVar25];
        plVar15[-1] = 0x14b81f;
        memset(pfVar22,0,lVar19 << 2);
        puVar20 = local_98;
      }
      uVar25 = uVar25 + 1;
    } while (local_88 != uVar25);
  }
  local_68 = pRVar24 + (uint)rn;
  _c_inter = f;
  if (local_38 == L'\x01' || local_5a != 2) {
    _class_set = 0;
    plVar10 = local_70;
    uVar25 = local_88;
    wVar7 = local_38;
    do {
      if (0 < (int)local_48) {
        local_39 = _class_set != 0 || wVar7 < L'\x01';
        local_b0 = 0;
        local_74 = 0;
        pvVar23 = _c_inter;
        pRVar24 = local_68;
        do {
          if (local_39 == '\0') {
            uVar14 = 0;
            do {
              if (puVar20[uVar14] == '\0') {
                pCVar26 = pvVar23->codebooks + pRVar24->classbook;
                if (pvVar23->valid_bits < L'\n') {
                  if (pvVar23->valid_bits == L'\0') {
                    pvVar23->acc = 0;
                  }
                  do {
                    if ((pvVar23->last_seg != L'\0') && (pvVar23->bytes_in_seg == '\0')) break;
                    plVar15[-1] = 0x14b929;
                    wVar6 = get8_packet_raw(pvVar23);
                    if (wVar6 == L'\xffffffff') break;
                    wVar16 = pvVar23->valid_bits;
                    pvVar23->acc = pvVar23->acc + (wVar6 << ((byte)wVar16 & 0x1f));
                    pvVar23->valid_bits = wVar16 + L'\b';
                  } while (wVar16 < L'\x11');
                }
                wVar6 = (wchar_t)pCVar26->fast_huffman[pvVar23->acc & 0x3ff];
                if (pCVar26->fast_huffman[pvVar23->acc & 0x3ff] < 0) {
                  plVar15[-1] = 0x14b9af;
                  wVar6 = codebook_decode_scalar_raw(pvVar23,pCVar26);
                }
                else {
                  bVar1 = pCVar26->codeword_lengths[wVar6];
                  pvVar23->acc = pvVar23->acc >> (bVar1 & 0x1f);
                  wVar12 = pvVar23->valid_bits - (uint)bVar1;
                  wVar16 = wVar12;
                  if (wVar12 < L'\x01') {
                    wVar16 = L'\0';
                  }
                  if (wVar12 < L'\0') {
                    wVar6 = L'\xffffffff';
                  }
                  pvVar23->valid_bits = wVar16;
                }
                if (pCVar26->sparse != '\0') {
                  wVar6 = pCVar26->sorted_values[wVar6];
                }
                bVar28 = wVar6 != L'\xffffffff';
                plVar10 = local_70;
                puVar20 = local_98;
                uVar25 = local_88;
                if (wVar6 == L'\xffffffff') goto LAB_0014bce9;
                *(uint8 **)(local_70[uVar14] + local_b0 * 8) = pRVar24->classdata[wVar6];
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar25);
          }
          iVar13 = (int)local_48;
          if ((0 < (int)local_80) && (local_74 < iVar13)) {
            lVar19 = 0;
            uVar14 = local_48;
            iVar9 = local_74;
            do {
              if (L'\0' < wVar7) {
                uVar21 = 0;
                alStack_d8[3] = lVar19;
                local_74 = iVar9;
                do {
                  if (puVar20[uVar21] == '\0') {
                    lVar17 = (long)pRVar24->residue_books
                                   [*(byte *)(*(long *)(plVar10[uVar21] + local_b0 * 8) + lVar19)]
                                   [_class_set];
                    if (lVar17 < 0) {
LAB_0014bc9f:
                      iVar13 = 0;
                    }
                    else {
                      uVar2 = pRVar24->part_size;
                      iVar13 = uVar2 * iVar9 + pRVar24->begin;
                      pCVar26 = pvVar23->codebooks + lVar17;
                      pfVar22 = local_a0[uVar21];
                      local_90 = CONCAT44(local_90._4_4_,uVar2);
                      alStack_d8[2] = uVar21;
                      if (local_5a == 0) {
                        uVar25 = (long)(int)uVar2 / (long)pCVar26->dimensions;
                        if ((int)uVar25 < 1) goto LAB_0014bc60;
                        uVar25 = uVar25 & 0xffffffff;
                        iVar9 = uVar2 * iVar9 + pRVar24->begin;
                        wVar7 = uVar2 - iVar9;
                        pfVar22 = pfVar22 + iVar9;
                        uVar14 = 0;
                        alStack_d8[1] = uVar25;
                        do {
                          pvVar23 = _c_inter;
                          local_34 = wVar7;
                          plVar15[-1] = 0x14bbdf;
                          wVar7 = codebook_decode_start(pvVar23,pCVar26);
                          uVar5 = (uint)wVar7 >> 0x1f;
                          if (wVar7 < L'\0') break;
                          wVar16 = ((int)local_90 - iVar13) - (int)uVar14;
                          wVar6 = pCVar26->dimensions;
                          if (wVar6 < wVar16) {
                            wVar16 = wVar6;
                          }
                          if (L'\0' < wVar16) {
                            lVar19 = (long)(wVar7 * wVar6);
                            if (local_34 <= wVar6) {
                              wVar6 = local_34;
                            }
                            uVar21 = (ulong)(uint)wVar6;
                            fVar29 = 0.0;
                            pfVar18 = pfVar22;
                            do {
                              fVar30 = pCVar26->multiplicands[lVar19] + fVar29;
                              *pfVar18 = *pfVar18 + fVar30;
                              if (pCVar26->sequence_p != '\0') {
                                fVar29 = fVar30;
                              }
                              pfVar18 = pfVar18 + uVar25;
                              lVar19 = lVar19 + 1;
                              uVar21 = uVar21 - 1;
                            } while (uVar21 != 0);
                          }
                          uVar14 = uVar14 + 1;
                          wVar7 = local_34 + L'\xffffffff';
                          pfVar22 = pfVar22 + 1;
                        } while (uVar14 != alStack_d8[1]);
                      }
                      else {
                        iVar9 = 0;
                        if ((int)uVar2 < 1) {
LAB_0014bc60:
                          uVar5 = 0;
                        }
                        else {
                          do {
                            pvVar23 = _c_inter;
                            plVar15[-1] = 0x14bad0;
                            wVar7 = codebook_decode_start(pvVar23,pCVar26);
                            uVar5 = (uint)wVar7 >> 0x1f;
                            if (wVar7 < L'\0') break;
                            wVar6 = pCVar26->dimensions;
                            wVar16 = (int)local_90 - iVar9;
                            if (wVar6 < (int)local_90 - iVar9) {
                              wVar16 = wVar6;
                            }
                            if (pCVar26->sequence_p == '\0') {
                              if (L'\0' < wVar16) {
                                uVar25 = 0;
                                do {
                                  pfVar22[(long)iVar13 + uVar25] =
                                       pCVar26->multiplicands[(long)(wVar7 * wVar6) + uVar25] + 0.0
                                       + pfVar22[(long)iVar13 + uVar25];
                                  uVar25 = uVar25 + 1;
                                } while ((uint)wVar16 != uVar25);
                              }
                            }
                            else if (L'\0' < wVar16) {
                              fVar29 = 0.0;
                              uVar25 = 0;
                              do {
                                fVar29 = fVar29 + pCVar26->multiplicands
                                                  [(long)(wVar7 * wVar6) + uVar25];
                                pfVar22[(long)iVar13 + uVar25] =
                                     pfVar22[(long)iVar13 + uVar25] + fVar29;
                                fVar29 = fVar29 + pCVar26->minimum_value;
                                uVar25 = uVar25 + 1;
                              } while ((uint)wVar16 != uVar25);
                            }
                            iVar9 = iVar9 + pCVar26->dimensions;
                            iVar13 = iVar13 + pCVar26->dimensions;
                          } while (iVar9 < (int)local_90);
                        }
                      }
                      uVar14 = local_48;
                      plVar10 = local_70;
                      puVar20 = local_98;
                      uVar25 = local_88;
                      lVar19 = alStack_d8[3];
                      uVar21 = alStack_d8[2];
                      pvVar23 = _c_inter;
                      pRVar24 = local_68;
                      wVar7 = local_38;
                      iVar9 = local_74;
                      if ((char)uVar5 == '\0') goto LAB_0014bc9f;
                      iVar13 = uVar5 << 3;
                    }
                    if (iVar13 != 0) {
                      bVar28 = false;
                      goto LAB_0014bce9;
                    }
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar25);
              }
              iVar13 = (int)uVar14;
              lVar19 = lVar19 + 1;
              local_74 = iVar9 + 1;
            } while ((lVar19 < local_80) && (iVar9 = local_74, local_74 < iVar13));
          }
          local_b0 = local_b0 + 1;
        } while (local_74 < iVar13);
      }
      bVar28 = true;
LAB_0014bce9:
    } while ((bVar28) && (_class_set = _class_set + 1, _class_set != 8));
  }
  else {
    if (local_38 < L'\x01') {
      uVar25 = 0;
    }
    else {
      uVar25 = 0;
      do {
        if (puVar20[uVar25] == '\0') goto LAB_0014bd0c;
        uVar25 = uVar25 + 1;
      } while (local_88 != uVar25);
      uVar25 = local_88 & 0xffffffff;
    }
LAB_0014bd0c:
    if ((wchar_t)uVar25 != local_38) {
      lVar19 = 0;
      wVar7 = local_38;
      do {
        if (wVar7 == L'\x02') {
          local_34 = 0;
          iVar13 = 0;
          while (pvVar23 = _c_inter, iVar13 < (int)local_48) {
            uVar5 = local_68->part_size * iVar13 + local_68->begin;
            local_58 = uVar5 & 1;
            local_54 = (int)uVar5 >> 1;
            if (lVar19 == 0) {
              pCVar26 = _c_inter->codebooks + local_68->classbook;
              if (_c_inter->valid_bits < L'\n') {
                if (_c_inter->valid_bits == L'\0') {
                  _c_inter->acc = 0;
                }
                do {
                  if ((pvVar23->last_seg != L'\0') && (pvVar23->bytes_in_seg == '\0')) break;
                  plVar15[-1] = 0x14bdc5;
                  wVar6 = get8_packet_raw(pvVar23);
                  if (wVar6 == L'\xffffffff') break;
                  wVar16 = pvVar23->valid_bits;
                  pvVar23->acc = pvVar23->acc + (wVar6 << ((byte)wVar16 & 0x1f));
                  pvVar23->valid_bits = wVar16 + L'\b';
                } while (wVar16 < L'\x11');
              }
              wVar6 = (wchar_t)pCVar26->fast_huffman[pvVar23->acc & 0x3ff];
              if (pCVar26->fast_huffman[pvVar23->acc & 0x3ff] < 0) {
                plVar15[-1] = 0x14be4b;
                wVar6 = codebook_decode_scalar_raw(pvVar23,pCVar26);
              }
              else {
                bVar1 = pCVar26->codeword_lengths[wVar6];
                pvVar23->acc = pvVar23->acc >> (bVar1 & 0x1f);
                wVar12 = pvVar23->valid_bits - (uint)bVar1;
                wVar16 = wVar12;
                if (wVar12 < L'\x01') {
                  wVar16 = L'\0';
                }
                if (wVar12 < L'\0') {
                  wVar6 = L'\xffffffff';
                }
                pvVar23->valid_bits = wVar16;
              }
              if (pCVar26->sparse != '\0') {
                wVar6 = pCVar26->sorted_values[wVar6];
              }
              if (wVar6 != L'\xffffffff') {
                *(uint8 **)(*local_70 + (long)local_34 * 8) = local_68->classdata[wVar6];
                goto LAB_0014be95;
              }
              iVar9 = 8;
            }
            else {
LAB_0014be95:
              if ((0 < (int)local_80) && (iVar13 < (int)local_48)) {
                lVar27 = (long)local_34;
                lVar17 = 1;
                do {
                  wVar7 = local_38;
                  pvVar23 = _c_inter;
                  ppfVar3 = local_a0;
                  lVar11 = (long)local_68->residue_books
                                 [*(byte *)(*(long *)(*local_70 + lVar27 * 8) + -1 + lVar17)]
                                 [lVar19];
                  iVar9 = (int)lVar17;
                  if (lVar11 < 0) {
                    uVar5 = local_68->part_size * (iVar13 + iVar9) + local_68->begin;
                    local_58 = uVar5 & 1;
                    local_54 = (int)uVar5 >> 1;
LAB_0014bf3a:
                    bVar28 = false;
                  }
                  else {
                    pCVar26 = _c_inter->codebooks;
                    plVar15[-1] = (ulong)local_68->part_size;
                    plVar15[-2] = local_90;
                    plVar15[-3] = 0x14bf10;
                    wVar7 = codebook_decode_deinterleave_repeat
                                      (pvVar23,pCVar26 + lVar11,ppfVar3,wVar7,&local_58,&local_54,
                                       *(wchar_t *)(plVar15 + -2),*(wchar_t *)(plVar15 + -1));
                    bVar28 = wVar7 == L'\0';
                    if (!bVar28) goto LAB_0014bf3a;
                  }
                  wVar7 = local_38;
                  if (bVar28) {
                    iVar13 = iVar13 + iVar9 + -1;
                    iVar9 = 1;
                    goto LAB_0014bf7c;
                  }
                  lVar11 = lVar17 + 1;
                } while ((lVar17 < local_80) && (lVar17 = lVar11, iVar9 + iVar13 < (int)local_48));
                iVar13 = iVar13 + (int)lVar11 + -1;
              }
              local_34 = local_34 + 1;
              iVar9 = 0;
            }
LAB_0014bf7c:
            if (iVar9 != 0) goto LAB_0014bd11;
          }
        }
        else if (L'\x02' < wVar7) {
          local_34 = 0;
          iVar13 = 0;
          while (pvVar23 = _c_inter, iVar13 < (int)local_48) {
            iVar9 = local_68->part_size * iVar13 + local_68->begin;
            local_58 = iVar9 % wVar7;
            local_54 = iVar9 / wVar7;
            if (lVar19 == 0) {
              pCVar26 = _c_inter->codebooks + local_68->classbook;
              if (_c_inter->valid_bits < L'\n') {
                if (_c_inter->valid_bits == L'\0') {
                  _c_inter->acc = 0;
                }
                do {
                  if ((pvVar23->last_seg != L'\0') && (pvVar23->bytes_in_seg == '\0')) break;
                  plVar15[-1] = 0x14c016;
                  wVar6 = get8_packet_raw(pvVar23);
                  if (wVar6 == L'\xffffffff') break;
                  wVar16 = pvVar23->valid_bits;
                  pvVar23->acc = pvVar23->acc + (wVar6 << ((byte)wVar16 & 0x1f));
                  pvVar23->valid_bits = wVar16 + L'\b';
                } while (wVar16 < L'\x11');
              }
              wVar6 = (wchar_t)pCVar26->fast_huffman[pvVar23->acc & 0x3ff];
              if (pCVar26->fast_huffman[pvVar23->acc & 0x3ff] < 0) {
                plVar15[-1] = 0x14c08e;
                wVar6 = codebook_decode_scalar_raw(pvVar23,pCVar26);
              }
              else {
                bVar1 = pCVar26->codeword_lengths[wVar6];
                pvVar23->acc = pvVar23->acc >> (bVar1 & 0x1f);
                wVar12 = pvVar23->valid_bits - (uint)bVar1;
                wVar16 = wVar12;
                if (wVar12 < L'\x01') {
                  wVar16 = L'\0';
                }
                if (wVar12 < L'\0') {
                  wVar6 = L'\xffffffff';
                }
                pvVar23->valid_bits = wVar16;
              }
              if (pCVar26->sparse != '\0') {
                wVar6 = pCVar26->sorted_values[wVar6];
              }
              if (wVar6 != L'\xffffffff') {
                *(uint8 **)(*local_70 + (long)local_34 * 8) = local_68->classdata[wVar6];
                goto LAB_0014c0d8;
              }
              iVar9 = 8;
            }
            else {
LAB_0014c0d8:
              if ((0 < (int)local_80) && (iVar13 < (int)local_48)) {
                lVar27 = (long)local_34;
                lVar17 = 1;
                do {
                  wVar7 = local_38;
                  pvVar23 = _c_inter;
                  ppfVar3 = local_a0;
                  lVar11 = (long)local_68->residue_books
                                 [*(byte *)(*(long *)(*local_70 + lVar27 * 8) + -1 + lVar17)]
                                 [lVar19];
                  iVar9 = (int)lVar17;
                  if (lVar11 < 0) {
                    iVar8 = local_68->part_size * (iVar13 + iVar9) + local_68->begin;
                    local_58 = iVar8 % local_38;
                    local_54 = iVar8 / local_38;
LAB_0014c179:
                    bVar28 = false;
                  }
                  else {
                    pCVar26 = _c_inter->codebooks;
                    plVar15[-1] = (ulong)local_68->part_size;
                    plVar15[-2] = local_90;
                    plVar15[-3] = 0x14c152;
                    wVar7 = codebook_decode_deinterleave_repeat
                                      (pvVar23,pCVar26 + lVar11,ppfVar3,wVar7,&local_58,&local_54,
                                       *(wchar_t *)(plVar15 + -2),*(wchar_t *)(plVar15 + -1));
                    bVar28 = wVar7 == L'\0';
                    if (!bVar28) goto LAB_0014c179;
                  }
                  wVar7 = local_38;
                  if (bVar28) {
                    iVar13 = iVar13 + iVar9 + -1;
                    iVar9 = 1;
                    goto LAB_0014c1bd;
                  }
                  lVar11 = lVar17 + 1;
                } while ((lVar17 < local_80) && (lVar17 = lVar11, iVar9 + iVar13 < (int)local_48));
                iVar13 = iVar13 + (int)lVar11 + -1;
              }
              local_34 = local_34 + 1;
              iVar9 = 0;
            }
LAB_0014c1bd:
            if (iVar9 != 0) goto LAB_0014bd11;
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
    }
  }
LAB_0014bd11:
  _c_inter->temp_offset = local_b4;
  return;
}

Assistant:

static void decode_residue(vorb *f, float *residue_buffers[], int ch, int n, int rn, uint8 *do_not_decode)
{
   int i,j,pass;
   Residue *r = f->residue_config + rn;
   int rtype = f->residue_types[rn];
   int c = r->classbook;
   int classwords = f->codebooks[c].dimensions;
   unsigned int actual_size = rtype == 2 ? n*2 : n;
   unsigned int limit_r_begin = (r->begin < actual_size ? r->begin : actual_size);
   unsigned int limit_r_end   = (r->end   < actual_size ? r->end   : actual_size);
   int n_read = limit_r_end - limit_r_begin;
   int part_read = n_read / r->part_size;
   int temp_alloc_point = temp_alloc_save(f);
   #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
   uint8 ***part_classdata = (uint8 ***) temp_block_array(f,f->channels, part_read * sizeof(**part_classdata));
   #else
   int **classifications = (int **) temp_block_array(f,f->channels, part_read * sizeof(**classifications));
   #endif

   CHECK(f);

   for (i=0; i < ch; ++i)
      if (!do_not_decode[i])
         memset(residue_buffers[i], 0, sizeof(float) * n);

   if (rtype == 2 && ch != 1) {
      for (j=0; j < ch; ++j)
         if (!do_not_decode[j])
            break;
      if (j == ch)
         goto done;

      for (pass=0; pass < 8; ++pass) {
         int pcount = 0, class_set = 0;
         if (ch == 2) {
            while (pcount < part_read) {
               int z = r->begin + pcount*r->part_size;
               int c_inter = (z & 1), p_inter = z>>1;
               if (pass == 0) {
                  Codebook *c = f->codebooks+r->classbook;
                  int q;
                  DECODE(q,f,c);
                  if (q == EOP) goto done;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  part_classdata[0][class_set] = r->classdata[q];
                  #else
                  for (i=classwords-1; i >= 0; --i) {
                     classifications[0][i+pcount] = q % r->classifications;
                     q /= r->classifications;
                  }
                  #endif
               }
               for (i=0; i < classwords && pcount < part_read; ++i, ++pcount) {
                  int z = r->begin + pcount*r->part_size;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  int c = part_classdata[0][class_set][i];
                  #else
                  int c = classifications[0][pcount];
                  #endif
                  int b = r->residue_books[c][pass];
                  if (b >= 0) {
                     Codebook *book = f->codebooks + b;
                     #ifdef STB_VORBIS_DIVIDES_IN_CODEBOOK
                     if (!codebook_decode_deinterleave_repeat(f, book, residue_buffers, ch, &c_inter, &p_inter, n, r->part_size))
                        goto done;
                     #else
                     // saves 1%
                     if (!codebook_decode_deinterleave_repeat(f, book, residue_buffers, ch, &c_inter, &p_inter, n, r->part_size))
                        goto done;
                     #endif
                  } else {
                     z += r->part_size;
                     c_inter = z & 1;
                     p_inter = z >> 1;
                  }
               }
               #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
               ++class_set;
               #endif
            }
         } else if (ch > 2) {
            while (pcount < part_read) {
               int z = r->begin + pcount*r->part_size;
               int c_inter = z % ch, p_inter = z/ch;
               if (pass == 0) {
                  Codebook *c = f->codebooks+r->classbook;
                  int q;
                  DECODE(q,f,c);
                  if (q == EOP) goto done;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  part_classdata[0][class_set] = r->classdata[q];
                  #else
                  for (i=classwords-1; i >= 0; --i) {
                     classifications[0][i+pcount] = q % r->classifications;
                     q /= r->classifications;
                  }
                  #endif
               }
               for (i=0; i < classwords && pcount < part_read; ++i, ++pcount) {
                  int z = r->begin + pcount*r->part_size;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  int c = part_classdata[0][class_set][i];
                  #else
                  int c = classifications[0][pcount];
                  #endif
                  int b = r->residue_books[c][pass];
                  if (b >= 0) {
                     Codebook *book = f->codebooks + b;
                     if (!codebook_decode_deinterleave_repeat(f, book, residue_buffers, ch, &c_inter, &p_inter, n, r->part_size))
                        goto done;
                  } else {
                     z += r->part_size;
                     c_inter = z % ch;
                     p_inter = z / ch;
                  }
               }
               #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
               ++class_set;
               #endif
            }
         }
      }
      goto done;
   }
   CHECK(f);

   for (pass=0; pass < 8; ++pass) {
      int pcount = 0, class_set=0;
      while (pcount < part_read) {
         if (pass == 0) {
            for (j=0; j < ch; ++j) {
               if (!do_not_decode[j]) {
                  Codebook *c = f->codebooks+r->classbook;
                  int temp;
                  DECODE(temp,f,c);
                  if (temp == EOP) goto done;
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  part_classdata[j][class_set] = r->classdata[temp];
                  #else
                  for (i=classwords-1; i >= 0; --i) {
                     classifications[j][i+pcount] = temp % r->classifications;
                     temp /= r->classifications;
                  }
                  #endif
               }
            }
         }
         for (i=0; i < classwords && pcount < part_read; ++i, ++pcount) {
            for (j=0; j < ch; ++j) {
               if (!do_not_decode[j]) {
                  #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
                  int c = part_classdata[j][class_set][i];
                  #else
                  int c = classifications[j][pcount];
                  #endif
                  int b = r->residue_books[c][pass];
                  if (b >= 0) {
                     float *target = residue_buffers[j];
                     int offset = r->begin + pcount * r->part_size;
                     int n = r->part_size;
                     Codebook *book = f->codebooks + b;
                     if (!residue_decode(f, book, target, offset, n, rtype))
                        goto done;
                  }
               }
            }
         }
         #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
         ++class_set;
         #endif
      }
   }
  done:
   CHECK(f);
   #ifndef STB_VORBIS_DIVIDES_IN_RESIDUE
   temp_free(f,part_classdata);
   #else
   temp_free(f,classifications);
   #endif
   temp_alloc_restore(f,temp_alloc_point);
}